

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::
     log<char_const(&)[48],kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [48],
               TestObject **params_1,TestObject **params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  TestObject **params_00;
  TestObject **params_01;
  long lVar3;
  undefined4 in_register_00000034;
  ArrayPtr<kj::String> in_stack_ffffffffffffff88;
  undefined8 uStack_68;
  String local_60;
  String local_48;
  
  str<char_const(&)[48]>
            ((String *)&stack0xffffffffffffff88,
             (kj *)"failed: expected (arr1.end()) <= (arr2.begin())",
             (char (*) [48])CONCAT44(in_register_00000014,severity));
  str<kj::(anonymous_namespace)::TestObject*&>
            (&local_60,(kj *)CONCAT44(in_register_00000034,line),params_00);
  str<kj::(anonymous_namespace)::TestObject*&>
            (&local_48,(kj *)CONCAT44(in_register_00000014,severity),params_01);
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,0x388470,&stack0xffffffffffffff88,
              in_stack_ffffffffffffff88);
  lVar3 = 0x30;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff88 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff90 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff88 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff90 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&uStack_68 + lVar3))
                (*(undefined8 **)((long)&uStack_68 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}